

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout_open.c
# Opt level: O2

int mpt_layout_open(mpt_output *out,char *desc,char *gen)

{
  _func_ssize_t_mpt_output_ptr_size_t_void_ptr *p_Var1;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  mpt_msgtype mt;
  
  mpt_layout_open::lid = -1;
  if ((((gen != (char *)0x0) && (iVar2 = strcasecmp("file",gen), iVar2 != 0)) &&
      (iVar2 = strcasecmp("lay",gen), iVar2 != 0)) &&
     (((iVar2 = strcasecmp("layout",gen), iVar2 != 0 && (iVar2 = strcasecmp("gen",gen), iVar2 != 0))
      && ((iVar2 = strcasecmp("generate",gen), iVar2 != 0 &&
          (iVar2 = strcasecmp("create",gen), iVar2 != 0)))))) {
    return -1;
  }
  iVar2 = (*out->_vptr->await)(out,setLayout,&mpt_layout_open::lid);
  if (iVar2 < 0) {
    return iVar2;
  }
  sVar3 = (*out->_vptr->push)(out,2,&mt);
  if (sVar3 < 0) {
    return (int)sVar3;
  }
  if (desc != (char *)0x0) {
    p_Var1 = out->_vptr->push;
    sVar4 = strlen(desc);
    sVar3 = (*p_Var1)(out,sVar4 + 1,desc);
    if (sVar3 < 0) goto LAB_00107ded;
  }
  sVar3 = (*out->_vptr->push)(out,0,(void *)0x0);
  if (-1 < sVar3) {
    (*out->_vptr->sync)(out,-1);
    if (mpt_layout_open::lid < 1) {
      return 0;
    }
    return mpt_layout_open::lid;
  }
LAB_00107ded:
  (*out->_vptr->push)(out,1,(void *)0x0);
  return (int)sVar3;
}

Assistant:

extern int mpt_layout_open(MPT_INTERFACE(output) *out, const char *desc, const char *gen)
{
	static int lid;
	MPT_STRUCT(msgtype) mt;
	ssize_t len;
	int err;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(LayoutOpen);
	
	lid = -1;
	
	/* specify generator mode */
	if (gen) {
		if (!strcasecmp("file", gen)) {
			mt.arg = MPT_MESGGRF(LayoutOpen);
		}
		else if (!strcasecmp("lay", gen) || !strcasecmp("layout", gen)) {
			mt.arg = MPT_MESGGRF(LayoutParse);
		}
		else if (!strcasecmp("gen", gen) || !strcasecmp("generate", gen) || !strcasecmp("create", gen)) {
			mt.arg = MPT_MESGGRF(LayoutCreate);
		}
		else {
			return -1;
		}
	}
	/* register layout id setter */
	if ((err = out->_vptr->await(out, setLayout, &lid)) < 0) {
		return err;
	}
	/* begin open operation */
	if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
		return len;
	}
	/* add layout description/filename */
	if (desc) {
		len = out->_vptr->push(out, strlen(desc)+1, desc);
	}
	/* finish message */
	if (len < 0 || (len = out->_vptr->push(out, 0, 0)) < 0) {
		out->_vptr->push(out, 1, 0);
		return len;
	}
	/* wait for answers to queries */
	out->_vptr->sync(out, -1);
	
	/* answer not arrived within call */
	if (lid < 0) {
		return 0;
	}
	return lid;
}